

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListEGL.cpp
# Opt level: O2

void glcts::getConfigListEGL(Platform *platform,ApiType type,ConfigList *configList)

{
  vector<glcts::AOSPConfig,_std::allocator<glcts::AOSPConfig>_> *this;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  EGLint EVar9;
  undefined4 extraout_var;
  NativeDisplayFactory *pNVar10;
  undefined4 extraout_var_00;
  Library *egl;
  EGLDisplay display;
  vector<glcts::ExcludedConfig,_std::allocator<glcts::ExcludedConfig>_> *this_00;
  Exception *this_01;
  ExcludeReason EVar11;
  pointer ppvVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  allocator<char> local_c5;
  uint local_c4;
  EGLint local_c0;
  EGLint local_bc;
  undefined1 local_b8 [32];
  EGLint local_98;
  int local_94;
  uint local_8c;
  EGLint local_88;
  EGLint local_84;
  EGLint local_80;
  EGLint local_7c;
  EGLint local_78;
  EGLint local_74;
  ConfigList *local_70;
  vector<void_*,_std::allocator<void_*>_> configs;
  UniquePtr<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_> nativeDisplay;
  undefined4 extraout_var_01;
  
  local_70 = configList;
  if (type.m_bits == 2) {
    uVar5 = 4;
  }
  else {
    uVar5 = 0x40;
    if (((type.m_bits != 3) && (type.m_bits != 0x13)) && (type.m_bits != 0x23)) {
      if ((type.m_bits & 0x300) != 0x100) {
        this_01 = (Exception *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,"Unsupported context type",(allocator<char> *)&configs);
        tcu::Exception::Exception(this_01,(string *)local_b8);
        __cxa_throw(this_01,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
      }
      uVar5 = 8;
    }
  }
  iVar6 = (*platform->_vptr_Platform[4])();
  pNVar10 = tcu::FactoryRegistry<eglu::NativeDisplayFactory>::getDefaultFactory
                      ((FactoryRegistry<eglu::NativeDisplayFactory> *)
                       (CONCAT44(extraout_var,iVar6) + 8));
  iVar6 = (*(pNVar10->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])(pNVar10);
  nativeDisplay.super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
  m_data.ptr = (NativeDisplay *)CONCAT44(extraout_var_00,iVar6);
  iVar6 = (*(nativeDisplay.
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
            ptr)->_vptr_NativeDisplay[2])
                    (nativeDisplay.
                     super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                     .m_data.ptr);
  egl = (Library *)CONCAT44(extraout_var_01,iVar6);
  display = eglu::getAndInitDisplay
                      (nativeDisplay.
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  eglu::getConfigs(&configs,egl,display);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"EGL_EXT_pixel_format_float",&local_c5);
  bVar2 = eglu::hasExtension(egl,display,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"EGL_EXT_yuv_surface",&local_c5);
  bVar3 = eglu::hasExtension(egl,display,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  this = &local_70->aospConfigs;
  this_00 = &local_70->excludedConfigs;
  for (ppvVar12 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppvVar12 !=
      configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish; ppvVar12 = ppvVar12 + 1) {
    local_c0 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3028);
    uVar7 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3040);
    uVar8 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3042);
    EVar9 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3024);
    local_74 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3023);
    local_78 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3022);
    local_7c = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3021);
    local_80 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3025);
    local_84 = EVar9;
    local_88 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3026);
    local_bc = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3031);
    bVar13 = (uVar7 & uVar5) != 0;
    bVar14 = (uVar8 & uVar5) != 0;
    local_8c = uVar7;
    if (bVar2) {
      EVar9 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3339);
      local_c4 = CONCAT31((int3)((uint)EVar9 >> 8),EVar9 == 0x333b);
    }
    else {
      local_c4 = 0;
    }
    bVar15 = true;
    if (bVar3) {
      EVar9 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x303f);
      bVar15 = EVar9 != 0x3300;
    }
    bVar4 = 0;
    if ((((local_8c & uVar5) != 0) && (bVar4 = 0, (uVar8 & uVar5) != 0)) && (local_bc == 0)) {
      bVar4 = bVar15 & ((byte)local_c4 ^ 1);
    }
    EVar9 = eglu::getConfigAttribInt(egl,display,*ppvVar12,0x3033);
    bVar1 = (byte)EVar9 << 4;
    EVar11 = (ExcludeReason)
             ((byte)((bVar1 | (byte)EVar9 >> 4) * '\x02' & 0x40 |
                    ((bVar1 & 0x10) << 2 | (bVar1 & 0x40) >> 2) * '\x02') >> 5);
    if (bVar13 && bVar14) {
      local_b8._0_4_ = CONFIGTYPE_EGL;
      local_b8._4_4_ = local_c0;
      local_b8._12_4_ = local_84;
      local_b8._16_4_ = local_74;
      local_b8._20_4_ = local_78;
      local_b8._24_4_ = local_7c;
      local_b8._28_4_ = local_80;
      local_98 = local_88;
      local_94 = local_bc;
      local_b8._8_4_ = EVar11;
      std::vector<glcts::AOSPConfig,_std::allocator<glcts::AOSPConfig>_>::
      emplace_back<glcts::AOSPConfig>(this,(AOSPConfig *)local_b8);
    }
    if (bVar4 == 0) {
      local_b8._8_4_ = EXCLUDEREASON_YUV - (local_c4 & 0xff);
      if (local_bc != 0) {
        local_b8._8_4_ = EXCLUDEREASON_MSAA;
      }
      if (!bVar13 || !bVar14) {
        local_b8._8_4_ = ZEXT14((uVar5 & local_8c) != 0);
      }
      local_b8._0_4_ = CONFIGTYPE_EGL;
      local_b8._4_4_ = local_c0;
      std::vector<glcts::ExcludedConfig,_std::allocator<glcts::ExcludedConfig>_>::
      emplace_back<glcts::ExcludedConfig>(this_00,(ExcludedConfig *)local_b8);
    }
    else {
      local_b8._0_4_ = CONFIGTYPE_EGL;
      local_b8._4_4_ = local_c0;
      local_b8._8_4_ = EVar11;
      std::vector<glcts::Config,_std::allocator<glcts::Config>_>::emplace_back<glcts::Config>
                (&local_70->configs,(Config *)local_b8);
    }
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&configs.super__Vector_base<void_*,_std::allocator<void_*>_>);
  de::details::UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>::
  ~UniqueBase(&nativeDisplay.
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>);
  return;
}

Assistant:

void getConfigListEGL(tcu::Platform& platform, glu::ApiType type, ConfigList& configList)
{
	try
	{
		getDefaultEglConfigList(platform, type, configList);
	}
	catch (const std::bad_cast&)
	{
		throw tcu::Exception("Platform is not tcu::EglPlatform");
	}
}